

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O2

time_t license::seconds_from_epoch(string *timeString)

{
  int iVar1;
  invalid_argument *piVar2;
  time_t tVar3;
  int day;
  int month;
  int year;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  tm tm;
  
  if (timeString->_M_string_length == 10) {
    iVar1 = __isoc99_sscanf((timeString->_M_dataplus)._M_p,"%4d-%2d-%2d",&year,&month,&day);
    if (iVar1 != 3) {
      iVar1 = __isoc99_sscanf((timeString->_M_dataplus)._M_p,"%4d/%2d/%2d",&year,&month,&day);
      if (iVar1 != 3) {
        piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_90,"Date [",timeString);
        std::operator+(&local_70,&local_90,"] not recognized");
        std::invalid_argument::invalid_argument(piVar2,(string *)&local_70);
        __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
  }
  else {
    if (timeString->_M_string_length != 8) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_90,"Date [",timeString);
      std::operator+(&local_70,&local_90,"] not recognized");
      std::invalid_argument::invalid_argument(piVar2,(string *)&local_70);
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    iVar1 = __isoc99_sscanf((timeString->_M_dataplus)._M_p,"%4d%2d%2d",&year,&month,&day);
    if (iVar1 != 3) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar2,"Date not recognized");
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  tm.tm_isdst = -1;
  tm.tm_year = year + -0x76c;
  tm.tm_mon = month + -1;
  tm.tm_mday = day;
  tm.tm_hour = 0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_wday = -1;
  tm.tm_yday = -1;
  tVar3 = mktime((tm *)&tm);
  return tVar3;
}

Assistant:

time_t seconds_from_epoch(const string &timeString) {
	int year, month, day;
	tm tm;
	if (timeString.size() == 8) {
		const int nfield = sscanf(timeString.c_str(), "%4d%2d%2d", &year, &month, &day);
		if (nfield != 3) {
			throw invalid_argument("Date not recognized");
		}
	} else if (timeString.size() == 10) {
		const int nfield = sscanf(timeString.c_str(), "%4d-%2d-%2d", &year, &month, &day);
		if (nfield != 3) {
			const int nfield = sscanf(timeString.c_str(), "%4d/%2d/%2d", &year, &month, &day);
			if (nfield != 3) {
				throw invalid_argument("Date [" + timeString + "] not recognized");
			}
		}
	} else {
		throw invalid_argument("Date [" + timeString + "] not recognized");
	}
	tm.tm_isdst = -1;
	tm.tm_year = year - 1900;
	tm.tm_mon = month - 1;
	tm.tm_mday = day;
	tm.tm_hour = 0;
	tm.tm_min = 0;
	tm.tm_sec = 0;
	tm.tm_yday = -1;
	tm.tm_wday = -1;
	return mktime(&tm);
}